

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O1

long __thiscall gl4cts::BasicBufferOperations::Run(BasicBufferOperations *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  void *pvVar1;
  long lVar2;
  GLuint i;
  long lVar3;
  ulong uVar4;
  GLuint i_2;
  uint *data_00;
  ulong uVar5;
  GLuint data [8];
  uint local_58 [10];
  
  this_00 = &(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  buffers = &this->buffer_;
  glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  lVar3 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x92c0,0x20,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,this->buffer_);
  pvVar1 = glu::CallLogWrapper::glMapBuffer(this_00,0x92c0,0x88b9);
  do {
    *(int *)((long)pvVar1 + lVar3 * 4) = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
  data_00 = local_58;
  glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,data_00);
  glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
  uVar4 = 0;
  lVar3 = 0;
  do {
    if (uVar4 != local_58[uVar4]) {
      gl4cts::anon_unknown_0::Output
                ("data[%u] is: %u should be: %u\n",uVar4 & 0xffffffff,(ulong)local_58[uVar4],
                 uVar4 & 0xffffffff);
      lVar3 = -1;
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
  lVar2 = -1;
  if (lVar3 == 0) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    lVar3 = 0;
    pvVar1 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,2);
    do {
      *(int *)((long)pvVar1 + lVar3 * 2) = (int)lVar3;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0x10);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    pvVar1 = glu::CallLogWrapper::glMapBufferRange(this_00,0x92c0,0,0x20,1);
    uVar5 = 0;
    uVar4 = 0;
    lVar2 = 0;
    do {
      if (uVar4 != *(uint *)((long)pvVar1 + uVar4 * 2)) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",uVar5,
                   (ulong)*(uint *)((long)local_58 + uVar4 * 2),uVar4 & 0xffffffff);
        lVar2 = -1;
      }
      uVar4 = uVar4 + 2;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar4 != 0x10);
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x92c0);
    lVar3 = 0;
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,*buffers);
    do {
      *data_00 = (uint)lVar3;
      lVar3 = lVar3 + 3;
      data_00 = data_00 + 1;
    } while (lVar3 != 0x18);
    glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,0x20,local_58);
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    glu::CallLogWrapper::glGetBufferSubData(this_00,0x92c0,0,0x20,local_58);
    glu::CallLogWrapper::glBindBuffer(this_00,0x92c0,0);
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (uVar4 != local_58[uVar5]) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",uVar5 & 0xffffffff,(ulong)local_58[uVar5],
                   uVar4 & 0xffffffff);
        lVar2 = -1;
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 3;
    } while (uVar5 != 8);
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8 * 4, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		GLuint* ptr = static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		long   res = NO_ERROR;
		GLuint data[8];
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i);
				res = ERROR;
			}
		}
		if (res != NO_ERROR)
			return res;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_WRITE_BIT));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i * 2;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 8; ++i)
		{
			if (ptr[i] != i * 2)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 2);
				res = ERROR;
			}
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = i * 3;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 32, data);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = 0;
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i * 3)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 3);
				res = ERROR;
			}
		}

		return res;
	}